

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true>::
Add<Js::JavascriptString*>
          (SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true> *this,
          unsigned_short propertyIndex,JavascriptString *propertyKey,PropertyAttributes attributes,
          bool isInitialized,bool isFixed,bool usedAsFixed,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  RecyclerWeakReference<Js::DynamicObject> **ppRVar3;
  undefined4 *puVar4;
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *this_01;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this_02;
  undefined1 local_50 [16];
  Type local_40;
  SimpleDictionaryPropertyDescriptor<unsigned_short> local_34;
  Type TStack_30;
  SimpleDictionaryPropertyDescriptor<unsigned_short> descriptor;
  JavascriptLibrary *library;
  bool usedAsFixed_local;
  bool isFixed_local;
  bool isInitialized_local;
  PropertyAttributes attributes_local;
  JavascriptString *propertyKey_local;
  unsigned_short propertyIndex_local;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true> *this_local;
  
  TStack_30.ptr = (RuntimeFunction *)ScriptContext::GetLibrary(scriptContext);
  if (propertyKey != (JavascriptString *)0x0) {
    SimpleDictionaryPropertyDescriptor<unsigned_short>::SimpleDictionaryPropertyDescriptor
              (&local_34,propertyIndex,attributes);
    if (((isFixed) || (usedAsFixed)) &&
       ((bVar2 = TPropertyKey_IsInternalPropertyId(propertyKey), bVar2 ||
        (ppRVar3 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                             ((WriteBarrierPtr *)(this + 0x20)),
        *ppRVar3 == (RecyclerWeakReference<Js::DynamicObject> *)0x0)))) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x41c,
                                  "((!isFixed && !usedAsFixed) || (!TPropertyKey_IsInternalPropertyId(propertyKey) && this->singletonInstance != nullptr))"
                                  ,
                                  "(!isFixed && !usedAsFixed) || (!TPropertyKey_IsInternalPropertyId(propertyKey) && this->singletonInstance != nullptr)"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    bVar2 = TPropertyKey_IsInternalPropertyId(propertyKey);
    if ((bVar2) || (bVar2 = TMapKey_IsSymbol(propertyKey,scriptContext), bVar2)) {
      bVar2 = TMapKey_IsJavascriptString<Js::JavascriptString*>();
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x41f,"(!TMapKey_IsJavascriptString<TMapKey>())",
                                    "!TMapKey_IsJavascriptString<TMapKey>()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      this[0x28] = (SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true>)
                   ((byte)this[0x28] & 0xfb | 4);
    }
    local_34._0_1_ = local_34._0_1_ & 0xf1 | isInitialized << 1 | isFixed << 2 | usedAsFixed << 3;
    this_00 = Memory::
              WriteBarrierPtr<JsUtil::BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>_>
              ::operator->((WriteBarrierPtr<JsUtil::BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>_>
                            *)(this + 0x18));
    local_40.ptr = (GlobalObject *)
                   TMapKey_ConvertKey<Js::JavascriptString*>(scriptContext,propertyKey);
    JsUtil::
    BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
    ::Add(this_00,(JavascriptString **)&local_40,&local_34);
    JavascriptLibrary::GetTypesWithNoSpecialPropertyProtoChainCache
              ((JavascriptLibrary *)(local_50 + 8));
    this_01 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::
              operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> *)
                         (local_50 + 8));
    PrototypeChainCache<Js::NoSpecialPropertyCache>::ProcessProperty<Js::JavascriptString*>
              (this_01,(DynamicTypeHandler *)this,attributes,propertyKey,scriptContext);
    JavascriptLibrary::GetTypesWithOnlyWritablePropertyProtoChainCache
              ((JavascriptLibrary *)local_50);
    this_02 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
              operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *
                         )local_50);
    PrototypeChainCache<Js::OnlyWritablePropertyCache>::ProcessProperty<Js::JavascriptString*>
              (this_02,(DynamicTypeHandler *)this,attributes,propertyKey,scriptContext);
  }
  return;
}

Assistant:

void SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::Add(
        TPropertyIndex propertyIndex,
        TPropertyKey propertyKey,
        PropertyAttributes attributes,
        bool isInitialized, bool isFixed, bool usedAsFixed,
        ScriptContext *const scriptContext)
    {
        JavascriptLibrary* library = scriptContext->GetLibrary();
        //
        // For a function with same named parameters,
        // property id Constants::NoProperty will be passed for all the dups except the last one
        // We need to allocate space for dups, but don't add those to map
        if (propertyKey != NULL)
        {
            SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor(propertyIndex, attributes);
            Assert((!isFixed && !usedAsFixed) || (!TPropertyKey_IsInternalPropertyId(propertyKey) && this->singletonInstance != nullptr));
            if (TPropertyKey_IsInternalPropertyId(propertyKey) || TMapKey_IsSymbol(propertyKey, scriptContext))
            {
                Assert(!TMapKey_IsJavascriptString<TMapKey>());
                hasNamelessPropertyId = true;
            }
#if ENABLE_FIXED_FIELDS
            descriptor.isInitialized = isInitialized;
            descriptor.isFixed = isFixed;
            descriptor.usedAsFixed = usedAsFixed;
#endif
            propertyMap->Add(TMapKey_ConvertKey<TMapKey>(scriptContext, propertyKey), descriptor);

            library->GetTypesWithNoSpecialPropertyProtoChainCache()->ProcessProperty(this, attributes, propertyKey, scriptContext);
            library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, attributes, propertyKey, scriptContext);
        }
    }